

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallString.h
# Opt level: O2

char * __thiscall llvm::SmallString<256U>::c_str(SmallString<256U> *this)

{
  char local_9;
  
  local_9 = '\0';
  SmallVectorTemplateBase<char,_true>::push_back
            ((SmallVectorTemplateBase<char,_true> *)this,&local_9);
  SmallVectorTemplateBase<char,_true>::pop_back((SmallVectorTemplateBase<char,_true> *)this);
  return (char *)(this->super_SmallVector<char,_256U>).super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
}

Assistant:

const char* c_str() {
    this->push_back(0);
    this->pop_back();
    return this->data();
  }